

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O2

void Assembler::procAsmLine(string *line,int n)

{
  bool bVar1;
  long lVar2;
  string *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"(\\s)+",(allocator *)&local_b0);
  HelpFuncts::split(&mline,line,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = std::operator==(mline.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,".text");
  if (!bVar1) {
    lVar2 = std::__cxx11::string::find
                      ((char)mline.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,0x3a);
    if (lVar2 == -1) {
      bVar1 = std::operator==(mline.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,".globl");
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   (mline.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        mainLine = HelpFuncts::countOpLabel(&local_50);
        this = &local_50;
      }
      else {
        std::__cxx11::string::string((string *)&local_90,(string *)line);
        procInst(&local_70,&local_90,n);
        std::operator+(&local_b0,"0x",&local_70);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &AsmFuncts::outCode_abi_cxx11_,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        this = &local_90;
      }
      std::__cxx11::string::~string((string *)this);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&mline);
  return;
}

Assistant:

void Assembler::procAsmLine(string line, int n){
    vector<string> mline = HelpFuncts::split(line,"(\\s)+");
    if((mline[0] == ".text") || (mline[0].find(':') != string::npos))
        return;
    if(mline[0] == ".globl") {
        mainLine = HelpFuncts::countOpLabel(mline[1]);
        return;
    }
    AsmFuncts::outCode.push_back("0x"+procInst(line, n));
}